

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

BBox3fa * __thiscall
embree::avx::PointsISA::vbounds
          (BBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar4 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
  lVar6 = i * *(long *)&(this->super_Points).field_0x68;
  fVar1 = *(float *)(lVar4 + lVar6);
  fVar2 = *(float *)(lVar4 + 4 + lVar6);
  fVar3 = *(float *)(lVar4 + 8 + lVar6);
  auVar7._0_4_ = fVar1 * (space->vx).field_0.m128[0] +
                 fVar3 * (space->vz).field_0.m128[0] + fVar2 * (space->vy).field_0.m128[0];
  auVar7._4_4_ = fVar1 * (space->vx).field_0.m128[1] +
                 fVar3 * (space->vz).field_0.m128[1] + fVar2 * (space->vy).field_0.m128[1];
  auVar7._8_4_ = fVar1 * (space->vx).field_0.m128[2] +
                 fVar3 * (space->vz).field_0.m128[2] + fVar2 * (space->vy).field_0.m128[2];
  auVar7._12_4_ =
       fVar1 * (space->vx).field_0.m128[3] +
       fVar3 * (space->vz).field_0.m128[3] + fVar2 * (space->vy).field_0.m128[3];
  fVar1 = *(float *)(lVar4 + 0xc + lVar6);
  auVar8._4_4_ = fVar1;
  auVar8._0_4_ = fVar1;
  auVar8._8_4_ = fVar1;
  auVar8._12_4_ = fVar1;
  auVar7 = vblendps_avx(auVar7,auVar8,8);
  auVar8 = ZEXT416((uint)(fVar1 * (this->super_Points).maxRadiusScale));
  auVar8 = vshufps_avx(auVar8,auVar8,0);
  aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar7,auVar8);
  (__return_storage_ptr__->lower).field_0 = aVar5;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar7._0_4_ + auVar8._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar7._4_4_ + auVar8._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar7._8_4_ + auVar8._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar7._12_4_ + auVar8._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const
      {
        return bounds(space, i);
      }